

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void ui::Loop(void)

{
  allocator<std::shared_ptr<ui::PanelBase>_> *this;
  allocator<ui::(anonymous_namespace)::Group> *this_00;
  initializer_list<std::shared_ptr<ui::PanelBase>_> __l;
  initializer_list<std::shared_ptr<ui::PanelBase>_> __l_00;
  initializer_list<std::shared_ptr<ui::PanelBase>_> __l_01;
  initializer_list<ui::(anonymous_namespace)::Group> __l_02;
  pointer *local_388;
  shared_ptr<ui::PanelBase> *local_370;
  shared_ptr<ui::PanelBase> *local_358;
  Group *local_340;
  shared_ptr<ftxui::ComponentBase> local_2c0;
  pointer *local_2b0;
  undefined1 local_2a8 [24];
  Component main_menu;
  shared_ptr<ui::PanelBase> local_278;
  iterator local_268;
  size_type local_260;
  allocator<char> local_253;
  undefined1 local_252;
  allocator<std::shared_ptr<ui::PanelBase>_> local_251;
  panel *local_250;
  undefined1 local_248 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_220;
  allocator<char> local_213;
  undefined1 local_212;
  allocator<std::shared_ptr<ui::PanelBase>_> local_211;
  ComponentBase **local_210;
  element_type local_208;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  element_type *local_1a8;
  size_type local_1a0;
  allocator<char> local_181;
  Group *local_180;
  Group local_178;
  string local_140 [32];
  vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>
  vStack_120;
  string local_108 [32];
  vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_> vStack_e8
  ;
  iterator local_d0;
  size_type local_c8;
  undefined1 local_c0 [8];
  vector<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_> groups
  ;
  ScreenInteractive screen;
  
  ftxui::ScreenInteractive::Fullscreen();
  main_menu.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _5_1_ = 1;
  local_180 = &local_178;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"System",&local_181);
  local_212 = 1;
  local_210 = (ComponentBase **)&local_208;
  panel::PRU();
  local_210 = (ComponentBase **)
              ((long)&local_208.super_ComponentBase.children_.
                      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
  panel::GPIO();
  local_210 = &local_208.super_ComponentBase.parent_;
  panel::EMMC();
  local_210 = (ComponentBase **)local_1d8;
  panel::Led();
  local_210 = (ComponentBase **)local_1c8;
  panel::passwd();
  local_210 = (ComponentBase **)local_1b8;
  panel::ssh();
  local_1a8 = &local_208;
  local_1a0 = 6;
  std::allocator<std::shared_ptr<ui::PanelBase>_>::allocator(&local_211);
  __l_01._M_len = local_1a0;
  __l_01._M_array = (iterator)local_1a8;
  std::vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>::
  vector(&local_178.groups,__l_01,&local_211);
  local_212 = 0;
  local_180 = (Group *)local_140;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"Network",&local_213);
  local_252 = 1;
  local_250 = (panel *)local_248;
  panel::WiFi(local_250,
              (ScreenInteractive *)
              &groups.
               super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_250 = (panel *)(local_248 + 0x10);
  panel::ICS();
  local_248._32_8_ = local_248;
  local_220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  std::allocator<std::shared_ptr<ui::PanelBase>_>::allocator(&local_251);
  __l_00._M_len = (size_type)local_220._M_pi;
  __l_00._M_array = (iterator)local_248._32_8_;
  std::vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>::
  vector(&vStack_120,__l_00,&local_251);
  local_252 = 0;
  local_180 = (Group *)local_108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"Info",&local_253);
  main_menu.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _6_1_ = 1;
  panel::About();
  local_268 = &local_278;
  local_260 = 1;
  this = (allocator<std::shared_ptr<ui::PanelBase>_> *)
         ((long)&main_menu.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi + 7);
  std::allocator<std::shared_ptr<ui::PanelBase>_>::allocator(this);
  __l._M_len = local_260;
  __l._M_array = local_268;
  std::vector<std::shared_ptr<ui::PanelBase>,_std::allocator<std::shared_ptr<ui::PanelBase>_>_>::
  vector(&vStack_e8,__l,this);
  main_menu.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _6_1_ = 0;
  main_menu.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _5_1_ = 0;
  local_d0 = &local_178;
  local_c8 = 3;
  this_00 = (allocator<ui::(anonymous_namespace)::Group> *)
            ((long)&main_menu.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 4);
  std::allocator<ui::(anonymous_namespace)::Group>::allocator(this_00);
  __l_02._M_len = local_c8;
  __l_02._M_array = local_d0;
  std::vector<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>::
  vector((vector<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
          *)local_c0,__l_02,this_00);
  std::allocator<ui::(anonymous_namespace)::Group>::~allocator
            ((allocator<ui::(anonymous_namespace)::Group> *)
             ((long)&main_menu.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4));
  local_340 = (Group *)&local_d0;
  do {
    local_340 = local_340 + -1;
    anon_unknown_1::Group::~Group(local_340);
  } while (local_340 != &local_178);
  std::allocator<std::shared_ptr<ui::PanelBase>_>::~allocator
            ((allocator<std::shared_ptr<ui::PanelBase>_> *)
             ((long)&main_menu.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  local_358 = (shared_ptr<ui::PanelBase> *)&local_268;
  do {
    local_358 = local_358 + -1;
    std::shared_ptr<ui::PanelBase>::~shared_ptr(local_358);
  } while (local_358 != &local_278);
  std::allocator<char>::~allocator(&local_253);
  std::allocator<std::shared_ptr<ui::PanelBase>_>::~allocator(&local_251);
  local_370 = (shared_ptr<ui::PanelBase> *)((long)local_248 + 0x20);
  do {
    local_370 = local_370 + -1;
    std::shared_ptr<ui::PanelBase>::~shared_ptr(local_370);
  } while (local_370 != (shared_ptr<ui::PanelBase> *)local_248);
  std::allocator<char>::~allocator(&local_213);
  std::allocator<std::shared_ptr<ui::PanelBase>_>::~allocator(&local_211);
  local_388 = (pointer *)&local_1a8;
  do {
    local_388 = local_388 + -2;
    std::shared_ptr<ui::PanelBase>::~shared_ptr((shared_ptr<ui::PanelBase> *)local_388);
  } while ((element_type *)local_388 != &local_208);
  std::allocator<char>::~allocator(&local_181);
  local_2b0 = &groups.
               super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ftxui::
  Make<ui::(anonymous_namespace)::MainMenu,std::vector<ui::(anonymous_namespace)::Group,std::allocator<ui::(anonymous_namespace)::Group>>,ftxui::ScreenInteractive*>
            ((vector<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
              *)local_2a8,(ScreenInteractive **)local_c0);
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr<ui::(anonymous_namespace)::MainMenu,void>
            ((shared_ptr<ftxui::ComponentBase> *)(local_2a8 + 0x10),
             (shared_ptr<ui::(anonymous_namespace)::MainMenu> *)local_2a8);
  std::shared_ptr<ui::(anonymous_namespace)::MainMenu>::~shared_ptr
            ((shared_ptr<ui::(anonymous_namespace)::MainMenu> *)local_2a8);
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr
            (&local_2c0,(shared_ptr<ftxui::ComponentBase> *)(local_2a8 + 0x10));
  ftxui::ScreenInteractive::Loop
            ((ScreenInteractive *)
             &groups.
              super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2c0);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(&local_2c0);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr
            ((shared_ptr<ftxui::ComponentBase> *)(local_2a8 + 0x10));
  std::vector<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>::
  ~vector((vector<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
           *)local_c0);
  ftxui::ScreenInteractive::~ScreenInteractive
            ((ScreenInteractive *)
             &groups.
              super__Vector_base<ui::(anonymous_namespace)::Group,_std::allocator<ui::(anonymous_namespace)::Group>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Loop() {
  auto screen = ScreenInteractive::Fullscreen();
  std::vector<Group> groups = {
      {"System",
       {
           panel::PRU(), panel::GPIO(), panel::EMMC(), panel::Led(),
           panel::passwd(), panel::ssh(),
           // TODO: panel::PlaceHolder("Sensor Stats and Configurations "),
           // TODO: panel::PlaceHolder("Firmware Update"),
           // TODO: panel::PlaceHolder("SSH"),
       }},
      {"Network",
       {
           panel::WiFi(&screen),
           panel::ICS(),
       }},
      {"Info",
       {
           // TODO: panel::PlaceHolder("Update"),
           panel::About(),
       }},
  };

  Component main_menu = Make<MainMenu>(std::move(groups), &screen);
  screen.Loop(main_menu);
}